

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  byte *z;
  char zBuf [16];
  DateTime x;
  byte local_68;
  byte local_67;
  byte local_66;
  byte local_65;
  byte local_64;
  undefined1 local_63;
  char local_62;
  char local_61;
  undefined1 local_60;
  char local_5f;
  char local_5e;
  undefined1 local_5d;
  DateTime local_50;
  
  z = &local_68;
  iVar3 = isDate(context,argc,argv,&local_50);
  if (iVar3 == 0) {
    computeYMD(&local_50);
    uVar1 = -local_50.Y;
    if (0 < local_50.Y) {
      uVar1 = local_50.Y;
    }
    uVar4 = (ulong)uVar1;
    local_67 = (char)(uVar1 / 1000) + (char)((uVar4 / 1000) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_66 = (char)(uVar1 / 100) + (char)((uVar4 / 100) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_65 = (char)(uVar1 / 10) + (char)((uVar4 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_64 = (char)uVar1 + ((char)(uVar1 / 10) + (char)(uVar1 / 10)) * -5 | 0x30;
    cVar2 = (char)(local_50.M / 10);
    local_62 = cVar2 + (char)((local_50.M / 10) / 10) * -10 + '0';
    local_61 = (char)local_50.M + cVar2 * -10 + '0';
    cVar2 = (char)(local_50.D / 10);
    local_5f = cVar2 + (char)((local_50.D / 10) / 10) * -10 + '0';
    local_5e = (char)local_50.D + cVar2 * -10 + '0';
    local_63 = 0x2d;
    local_60 = 0x2d;
    local_5d = 0;
    if (local_50.Y < 0) {
      local_68 = 0x2d;
      iVar3 = 0xb;
    }
    else {
      z = &local_67;
      iVar3 = 10;
    }
    setResultStrOrError(context,(char *)z,iVar3,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y;
    char zBuf[16];
    computeYMD(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 11, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 10, SQLITE_TRANSIENT);
    }
  }
}